

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void m68k_tr_init_disas_context(DisasContextBase_conflict1 *dcbase,CPUState *cpu)

{
  TranslationBlock_conflict *pTVar1;
  CPUM68KState_conflict *env;
  DisasContextBase_conflict1 *__mptr;
  DisasContext_conflict2 *dc;
  CPUState *cpu_local;
  DisasContextBase_conflict1 *dcbase_local;
  
  pTVar1 = (TranslationBlock_conflict *)cpu->env_ptr;
  *(uc_struct_conflict7 **)&dcbase[6].is_jmp = cpu->uc;
  dcbase[1].tb = pTVar1;
  dcbase[1].pc_first = dcbase->pc_first;
  dcbase[1].pc_next = 0;
  dcbase[1].is_jmp = DISAS_TOO_MANY;
  *(undefined4 *)&dcbase[2].tb = 0;
  *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
  init_release_array((DisasContext_conflict2 *)dcbase);
  return;
}

Assistant:

static void m68k_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUM68KState *env = cpu->env_ptr;

    // unicorn setup
    dc->uc = cpu->uc;

    dc->env = env;
    dc->pc = dc->base.pc_first;
    dc->cc_op = CC_OP_DYNAMIC;
    dc->cc_op_synced = 1;
    dc->done_mac = 0;
    dc->writeback_mask = 0;
    init_release_array(dc);
}